

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O1

void __thiscall CompoundFile::MSAT::loadMSAT(MSAT *this)

{
  istream *piVar1;
  iterator __position;
  uint uVar2;
  int32_t secID_1;
  int32_t i;
  int iVar3;
  int iVar4;
  long lVar5;
  int32_t secID;
  uint uVar6;
  char c;
  char c_1;
  SecID local_6c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_68;
  MSAT *local_50;
  uint local_44;
  ulong local_40;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *local_38;
  
  piVar1 = this->m_stream;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_finish = (SecID *)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (SecID *)0x0;
  iVar3 = 0;
  local_50 = this;
  do {
    lVar5 = 0;
    uVar6 = 0;
    do {
      local_6c.m_id = local_6c.m_id & 0xffffff00;
      std::istream::get((char *)piVar1);
      uVar6 = uVar6 | (local_6c.m_id & 0xffU) << ((byte)lVar5 & 0x1f);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x20);
    if (uVar6 != 0xffffffff) {
      local_6c.m_id = uVar6;
      if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
        _M_realloc_insert<CompoundFile::SecID>
                  (&local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
         _M_impl.super__Vector_impl_data._M_finish)->m_id = uVar6;
        local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x6d);
  local_38 = &this->m_msat;
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::_M_move_assign
            (local_38,&local_68);
  if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_44 = this->m_header->m_sectorsInMSAT;
  if (0 < (int)local_44) {
    uVar6 = (this->m_header->m_msatFirstSecID).m_id;
    local_40 = 0;
    do {
      std::istream::seekg(this->m_stream,
                          (long)(int)uVar6 * (long)this->m_header->m_sectorSize + 0x200,0);
      piVar1 = this->m_stream;
      iVar3 = this->m_header->m_sectorSize;
      if (7 < iVar3) {
        iVar4 = iVar3 + -1;
        if (-1 < iVar3 + -4) {
          iVar4 = iVar3 + -4;
        }
        iVar3 = iVar4 >> 2;
        if (iVar4 >> 2 < 2) {
          iVar3 = 1;
        }
        iVar4 = 0;
        do {
          lVar5 = 0;
          uVar6 = 0;
          do {
            local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_68.
                                  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
            std::istream::get((char *)piVar1);
            uVar6 = uVar6 | (uint)(byte)local_68.
                                        super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                        ._M_impl.super__Vector_impl_data._M_start <<
                            ((byte)lVar5 & 0x1f);
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0x20);
          local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_68.
                                 super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar6);
          __position._M_current =
               (local_50->m_msat).
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_50->m_msat).
              super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
            _M_realloc_insert<CompoundFile::SecID>(local_38,__position,(SecID *)&local_68);
          }
          else {
            (__position._M_current)->m_id = uVar6;
            (local_50->m_msat).
            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != iVar3);
      }
      lVar5 = 0;
      uVar6 = 0;
      do {
        local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_68.
                              super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        std::istream::get((char *)piVar1);
        uVar6 = uVar6 | (uint)(byte)local_68.
                                    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                    ._M_impl.super__Vector_impl_data._M_start <<
                        ((byte)lVar5 & 0x1f);
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      uVar2 = (int)local_40 + 1;
      local_40 = (ulong)uVar2;
      this = local_50;
    } while (uVar2 != local_44);
  }
  return;
}

Assistant:

inline void
MSAT::loadMSAT()
{
	m_msat = loadFirst109SecIDs( m_stream );

	const int32_t msatSectorsCount = m_header.sectorsInMSAT();

	SecID id = m_header.msatFirstSecID();

	for( int32_t i = 0; i < msatSectorsCount; ++i )
	{
		m_stream.seekg( calcFileOffset( id, m_header.sectorSize() ) );

		loadMSATSector( m_stream, m_msat, id, m_header.sectorSize() );
	}
}